

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

parameter * __thiscall
clipp::detail::action_provider<clipp::parameter>::call
          (action_provider<clipp::parameter> *this,simple_action *a)

{
  value_type *in_RDI;
  value_type *this_00;
  simple_action_adapter *__f;
  function<void_(const_char_*)> *in_stack_ffffffffffffffa0;
  simple_action_adapter local_50 [2];
  
  __f = local_50;
  this_00 = in_RDI;
  simple_action_adapter::simple_action_adapter
            ((simple_action_adapter *)in_RDI,(simple_action *)in_RDI);
  std::function<void(char_const*)>::
  function<clipp::detail::action_provider<clipp::parameter>::simple_action_adapter,void>
            (in_stack_ffffffffffffffa0,__f);
  std::
  vector<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>::
  push_back((vector<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
             *)this_00,in_RDI);
  std::function<void_(const_char_*)>::~function((function<void_(const_char_*)> *)0x183c56);
  simple_action_adapter::~simple_action_adapter((simple_action_adapter *)0x183c60);
  return (parameter *)&this_00[-2]._M_invoker;
}

Assistant:

Derived&
    call(simple_action a) {
        argActions_.push_back(simple_action_adapter(std::move(a)));
        return *static_cast<Derived*>(this);
    }